

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::from_kreach(Graph *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  long *plVar5;
  reference pvVar6;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  vertex_t neighbor;
  vertex_t num_neighbors;
  ulong local_578;
  size_t counted_edges;
  stringstream local_568 [4];
  vertex_t current_vertex;
  ulong local_3e0;
  size_t num_edges;
  istream local_3c8 [8];
  ifstream fin;
  string local_1c0 [8];
  string line;
  stringstream local_1a0 [8];
  stringstream ss;
  string *filename_local;
  Graph *this_local;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string(local_1c0);
  std::ifstream::ifstream(local_3c8,(string *)filename,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    __assert_fail("fin.is_open()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                  ,0x10,"void Graph::from_kreach(const std::string &)");
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3c8,local_1c0);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_568,local_1c0,_Var3);
  std::__cxx11::stringstream::operator=(local_1a0,local_568);
  std::__cxx11::stringstream::~stringstream(local_568);
  piVar4 = (istream *)std::istream::operator>>((istream *)local_1a0,&this->num_vertices_);
  std::istream::operator>>(piVar4,&local_3e0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->succ_,(ulong)this->num_vertices_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->pred_,(ulong)this->num_vertices_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->deg_,(ulong)this->num_vertices_);
  counted_edges._4_4_ = 0;
  local_578 = 0;
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_3c8,local_1c0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)&neighbor,local_1c0,_Var3);
    std::__cxx11::stringstream::operator=(local_1a0,(stringstream *)&neighbor);
    std::__cxx11::stringstream::~stringstream((stringstream *)&neighbor);
    std::istream::operator>>((istream *)local_1a0,(uint *)((long)&counted_edges + 4));
    std::istream::operator>>((istream *)local_1a0,(uint *)((long)&__range1 + 4));
    while( true ) {
      plVar5 = (long *)std::istream::operator>>((istream *)local_1a0,(uint *)&__range1);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at(&this->succ_,(ulong)counted_edges._4_4_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar6,(value_type *)&__range1);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at(&this->pred_,(ulong)(uint)__range1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar6,(value_type *)((long)&counted_edges + 4));
      local_578 = local_578 + 1;
    }
  }
  if (counted_edges._4_4_ + 1 != this->num_vertices_) {
    __assert_fail("current_vertex + 1 == num_vertices_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                  ,0x29,"void Graph::from_kreach(const std::string &)");
  }
  if (local_578 != local_3e0) {
    __assert_fail("counted_edges == num_edges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                  ,0x2a,"void Graph::from_kreach(const std::string &)");
  }
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(&this->succ_);
  i = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end(&this->succ_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&i), bVar2) {
    pvVar7 = __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end1);
    iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar7);
    iVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar7);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar8._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar9._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin(&this->pred_);
  i_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::end(&this->pred_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                             *)&i_1), bVar2) {
    pvVar7 = __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end1_1);
    iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar7);
    iVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar7);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar8._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar9._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::ifstream::~ifstream(local_3c8);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Graph::from_kreach(const std::string &filename) {
    stringstream ss;
    string line;

    ifstream fin(filename);
    assert(fin.is_open());

    size_t num_edges;
    getline(fin, line);
    ss = stringstream(line);
    ss >> num_vertices_ >> num_edges;

    succ_.resize(num_vertices_);
    pred_.resize(num_vertices_);
    deg_.resize(num_vertices_);

    vertex_t current_vertex = 0;
    size_t counted_edges = 0;
    for (; getline(fin, line);) {
        ss = stringstream(line);
        ss >> current_vertex;
        vertex_t num_neighbors;
        ss >> num_neighbors;
        for (vertex_t neighbor; ss >> neighbor;) {
            succ_.at(current_vertex).push_back(neighbor);
            pred_.at(neighbor).push_back(current_vertex);
            ++counted_edges;
        }
    }

    assert(current_vertex + 1 == num_vertices_);
    assert(counted_edges == num_edges);

    for (auto &i : succ_) {
        sort(i.begin(), i.end());
    }
    for (auto &i : pred_) {
        sort(i.begin(), i.end());
    }
}